

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_CMap_New(FT_CMap_Class clazz,FT_Pointer init_data,FT_CharMap charmap,
                    FT_CMap_conflict *acmap)

{
  int iVar1;
  FT_Face pFVar2;
  FT_Memory memory_00;
  FT_CharMap *ppFVar3;
  FT_CMap_conflict local_50;
  FT_CMap_conflict cmap;
  FT_Memory memory;
  FT_Face face;
  FT_CMap_conflict *ppFStack_30;
  FT_Error error;
  FT_CMap_conflict *acmap_local;
  FT_CharMap charmap_local;
  FT_Pointer init_data_local;
  FT_CMap_Class clazz_local;
  
  face._4_4_ = 0;
  if (((clazz == (FT_CMap_Class)0x0) || (charmap == (FT_CharMap)0x0)) ||
     (charmap->face == (FT_Face)0x0)) {
    return 6;
  }
  pFVar2 = charmap->face;
  memory_00 = pFVar2->memory;
  ppFStack_30 = acmap;
  acmap_local = (FT_CMap_conflict *)charmap;
  charmap_local = (FT_CharMap)init_data;
  init_data_local = clazz;
  local_50 = (FT_CMap_conflict)ft_mem_alloc(memory_00,clazz->size,(FT_Error *)((long)&face + 4));
  if (face._4_4_ == 0) {
    (local_50->charmap).face = (FT_Face)*acmap_local;
    *(FT_CMap_conflict *)&(local_50->charmap).encoding = acmap_local[1];
    local_50->clazz = (FT_CMap_Class)init_data_local;
    if ((*(long *)((long)init_data_local + 8) == 0) ||
       (face._4_4_ = (**(code **)((long)init_data_local + 8))(local_50,charmap_local),
       face._4_4_ == 0)) {
      ppFVar3 = (FT_CharMap *)
                ft_mem_realloc(memory_00,8,(long)pFVar2->num_charmaps,
                               (long)(pFVar2->num_charmaps + 1),pFVar2->charmaps,
                               (FT_Error *)((long)&face + 4));
      pFVar2->charmaps = ppFVar3;
      if (face._4_4_ == 0) {
        iVar1 = pFVar2->num_charmaps;
        pFVar2->num_charmaps = iVar1 + 1;
        pFVar2->charmaps[iVar1] = (FT_CharMap)local_50;
        goto LAB_002d53dc;
      }
    }
    ft_cmap_done_internal(local_50);
    local_50 = (FT_CMap_conflict)0x0;
  }
LAB_002d53dc:
  if (ppFStack_30 != (FT_CMap_conflict *)0x0) {
    *ppFStack_30 = local_50;
  }
  return face._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_CMap_New( FT_CMap_Class  clazz,
               FT_Pointer     init_data,
               FT_CharMap     charmap,
               FT_CMap       *acmap )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Face    face;
    FT_Memory  memory;
    FT_CMap    cmap = NULL;


    if ( !clazz || !charmap || !charmap->face )
      return FT_THROW( Invalid_Argument );

    face   = charmap->face;
    memory = FT_FACE_MEMORY( face );

    if ( !FT_ALLOC( cmap, clazz->size ) )
    {
      cmap->charmap = *charmap;
      cmap->clazz   = clazz;

      if ( clazz->init )
      {
        error = clazz->init( cmap, init_data );
        if ( error )
          goto Fail;
      }

      /* add it to our list of charmaps */
      if ( FT_RENEW_ARRAY( face->charmaps,
                           face->num_charmaps,
                           face->num_charmaps + 1 ) )
        goto Fail;

      face->charmaps[face->num_charmaps++] = (FT_CharMap)cmap;
    }

  Exit:
    if ( acmap )
      *acmap = cmap;

    return error;

  Fail:
    ft_cmap_done_internal( cmap );
    cmap = NULL;
    goto Exit;
  }